

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

void __thiscall QLocale::QLocale(QLocale *this,QStringView name)

{
  quint16 qVar1;
  bool bVar2;
  QLocaleId lid;
  undefined **ppuVar3;
  qsizetype qVar4;
  storage_type_conflict *extraout_RDX;
  long in_FS_OFFSET;
  QStringView name_00;
  QStringView local_38;
  QStringView local_28;
  long local_18;
  
  local_28.m_data = name.m_data;
  local_28.m_size = name.m_size;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.m_size = 1;
  local_38.m_data = L"C";
  bVar2 = ::comparesEqual(&local_28,&local_38);
  if (bVar2) {
    ppuVar3 = &c_private()::c_locale;
  }
  else {
    name_00.m_data = extraout_RDX;
    name_00.m_size = (qsizetype)local_28.m_data;
    lid = QLocaleId::fromName((QLocaleId *)local_28.m_size,name_00);
    qVar4 = QLocaleData::findLocaleIndex(lid);
    ppuVar3 = (undefined **)operator_new(0x20);
    qVar1 = locale_data[qVar4].m_language_id;
    ((QLocalePrivate *)ppuVar3)->m_data = locale_data + qVar4;
    (((QLocalePrivate *)ppuVar3)->ref)._q_value.super___atomic_base<int>._M_i = 0;
    ((QLocalePrivate *)ppuVar3)->m_index = qVar4;
    (((QLocalePrivate *)ppuVar3)->m_numberOptions).
    super_QFlagsStorageHelper<QLocale::NumberOption,_4>.super_QFlagsStorage<QLocale::NumberOption>.i
         = (uint)(qVar1 == 1);
  }
  (this->d).d.ptr = (QLocalePrivate *)ppuVar3;
  LOCK();
  (((QLocalePrivate *)ppuVar3)->ref)._q_value.super___atomic_base<int>._M_i =
       (((QLocalePrivate *)ppuVar3)->ref)._q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QLocale::QLocale(QStringView name)
    : d(localePrivateByName(name))
{
}